

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslkey_p.cpp
# Opt level: O3

QDebug operator<<(QDebug debug,QSslKey *key)

{
  char *pcVar1;
  int iVar2;
  long *plVar3;
  undefined8 *in_RDX;
  char *pcVar4;
  storage_type *psVar5;
  QSslKeyPrivate *pQVar6;
  long in_FS_OFFSET;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QDebugStateSaver saver;
  undefined1 *local_58;
  QArrayData *local_50 [3];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_58,(QDebug *)key);
  plVar3 = (long *)QDebug::resetFormat();
  *(undefined1 *)(*plVar3 + 0x30) = 0;
  pQVar6 = (key->d).d.ptr;
  QVar7.m_data = (storage_type *)0x8;
  QVar7.m_size = (qsizetype)local_50;
  QString::fromUtf8(QVar7);
  QTextStream::operator<<((QTextStream *)pQVar6,(QString *)local_50);
  if (local_50[0] != (QArrayData *)0x0) {
    LOCK();
    (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_50[0],2,0x10);
    }
  }
  pQVar6 = (key->d).d.ptr;
  if (*(char *)&pQVar6[3].backend._M_t.
                super___uniq_ptr_impl<QTlsPrivate::TlsKey,_std::default_delete<QTlsPrivate::TlsKey>_>
                ._M_t.
                super__Tuple_impl<0UL,_QTlsPrivate::TlsKey_*,_std::default_delete<QTlsPrivate::TlsKey>_>
      == '\x01') {
    QTextStream::operator<<((QTextStream *)pQVar6,' ');
  }
  if (*(long **)*in_RDX != (long *)0x0) {
    iVar2 = (**(code **)(**(long **)*in_RDX + 0x50))();
    if (iVar2 != 1) {
      pcVar4 = "PrivateKey";
      goto LAB_0024b004;
    }
  }
  pcVar4 = "PublicKey";
LAB_0024b004:
  pQVar6 = (key->d).d.ptr;
  psVar5 = (storage_type *)0xffffffffffffffff;
  do {
    pcVar1 = psVar5 + (long)(pcVar4 + 1);
    psVar5 = psVar5 + 1;
  } while (*pcVar1 != '\0');
  QVar8.m_data = psVar5;
  QVar8.m_size = (qsizetype)local_50;
  QString::fromUtf8(QVar8);
  QTextStream::operator<<((QTextStream *)pQVar6,(QString *)local_50);
  if (local_50[0] != (QArrayData *)0x0) {
    LOCK();
    (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_50[0],2,0x10);
    }
  }
  pQVar6 = (key->d).d.ptr;
  if (*(char *)&pQVar6[3].backend._M_t.
                super___uniq_ptr_impl<QTlsPrivate::TlsKey,_std::default_delete<QTlsPrivate::TlsKey>_>
                ._M_t.
                super__Tuple_impl<0UL,_QTlsPrivate::TlsKey_*,_std::default_delete<QTlsPrivate::TlsKey>_>
      == '\x01') {
    QTextStream::operator<<((QTextStream *)pQVar6,' ');
    pQVar6 = (key->d).d.ptr;
  }
  QVar9.m_data = (storage_type *)0x2;
  QVar9.m_size = (qsizetype)local_50;
  QString::fromUtf8(QVar9);
  QTextStream::operator<<((QTextStream *)pQVar6,(QString *)local_50);
  if (local_50[0] != (QArrayData *)0x0) {
    LOCK();
    (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_50[0],2,0x10);
    }
  }
  pQVar6 = (key->d).d.ptr;
  if (*(char *)&pQVar6[3].backend._M_t.
                super___uniq_ptr_impl<QTlsPrivate::TlsKey,_std::default_delete<QTlsPrivate::TlsKey>_>
                ._M_t.
                super__Tuple_impl<0UL,_QTlsPrivate::TlsKey_*,_std::default_delete<QTlsPrivate::TlsKey>_>
      == '\x01') {
    QTextStream::operator<<((QTextStream *)pQVar6,' ');
  }
  pcVar4 = "OPAQUE";
  if (*(long **)*in_RDX != (long *)0x0) {
    iVar2 = (**(code **)(**(long **)*in_RDX + 0x58))();
    if (iVar2 != 0) {
      pcVar4 = "EC";
      if (*(long **)*in_RDX != (long *)0x0) {
        iVar2 = (**(code **)(**(long **)*in_RDX + 0x58))();
        if (iVar2 == 1) {
          pcVar4 = "RSA";
        }
        else if (*(long **)*in_RDX != (long *)0x0) {
          iVar2 = (**(code **)(**(long **)*in_RDX + 0x58))();
          if (iVar2 == 2) {
            pcVar4 = "DSA";
          }
          else if (*(long **)*in_RDX != (long *)0x0) {
            iVar2 = (**(code **)(**(long **)*in_RDX + 0x58))();
            pcVar4 = "EC";
            if (iVar2 == 4) {
              pcVar4 = "DH";
            }
          }
        }
      }
    }
  }
  pQVar6 = (key->d).d.ptr;
  psVar5 = (storage_type *)0xffffffffffffffff;
  do {
    pcVar1 = psVar5 + (long)(pcVar4 + 1);
    psVar5 = psVar5 + 1;
  } while (*pcVar1 != '\0');
  QVar10.m_data = psVar5;
  QVar10.m_size = (qsizetype)local_50;
  QString::fromUtf8(QVar10);
  QTextStream::operator<<((QTextStream *)pQVar6,(QString *)local_50);
  if (local_50[0] != (QArrayData *)0x0) {
    LOCK();
    (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_50[0],2,0x10);
    }
  }
  pQVar6 = (key->d).d.ptr;
  if (*(char *)&pQVar6[3].backend._M_t.
                super___uniq_ptr_impl<QTlsPrivate::TlsKey,_std::default_delete<QTlsPrivate::TlsKey>_>
                ._M_t.
                super__Tuple_impl<0UL,_QTlsPrivate::TlsKey_*,_std::default_delete<QTlsPrivate::TlsKey>_>
      == '\x01') {
    QTextStream::operator<<((QTextStream *)pQVar6,' ');
    pQVar6 = (key->d).d.ptr;
  }
  QVar11.m_data = (storage_type *)0x2;
  QVar11.m_size = (qsizetype)local_50;
  QString::fromUtf8(QVar11);
  QTextStream::operator<<((QTextStream *)pQVar6,(QString *)local_50);
  if (local_50[0] != (QArrayData *)0x0) {
    LOCK();
    (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_50[0],2,0x10);
    }
  }
  pQVar6 = (key->d).d.ptr;
  if (*(char *)&pQVar6[3].backend._M_t.
                super___uniq_ptr_impl<QTlsPrivate::TlsKey,_std::default_delete<QTlsPrivate::TlsKey>_>
                ._M_t.
                super__Tuple_impl<0UL,_QTlsPrivate::TlsKey_*,_std::default_delete<QTlsPrivate::TlsKey>_>
      == '\x01') {
    QTextStream::operator<<((QTextStream *)pQVar6,' ');
  }
  if (*(long **)*in_RDX == (long *)0x0) {
    iVar2 = -1;
  }
  else {
    iVar2 = (**(code **)(**(long **)*in_RDX + 0x60))();
  }
  QTextStream::operator<<((QTextStream *)(key->d).d.ptr,iVar2);
  pQVar6 = (key->d).d.ptr;
  if (*(char *)&pQVar6[3].backend._M_t.
                super___uniq_ptr_impl<QTlsPrivate::TlsKey,_std::default_delete<QTlsPrivate::TlsKey>_>
                ._M_t.
                super__Tuple_impl<0UL,_QTlsPrivate::TlsKey_*,_std::default_delete<QTlsPrivate::TlsKey>_>
      == '\x01') {
    QTextStream::operator<<((QTextStream *)pQVar6,' ');
    pQVar6 = (key->d).d.ptr;
  }
  QTextStream::operator<<((QTextStream *)pQVar6,')');
  pQVar6 = (key->d).d.ptr;
  if (*(char *)&pQVar6[3].backend._M_t.
                super___uniq_ptr_impl<QTlsPrivate::TlsKey,_std::default_delete<QTlsPrivate::TlsKey>_>
                ._M_t.
                super__Tuple_impl<0UL,_QTlsPrivate::TlsKey_*,_std::default_delete<QTlsPrivate::TlsKey>_>
      == '\x01') {
    QTextStream::operator<<((QTextStream *)pQVar6,' ');
    pQVar6 = (key->d).d.ptr;
  }
  (key->d).d.ptr = (QSslKeyPrivate *)0x0;
  *(QSslKeyPrivate **)debug.stream = pQVar6;
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QDebug)debug.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug debug, const QSslKey &key)
{
    QDebugStateSaver saver(debug);
    debug.resetFormat().nospace();
    debug << "QSslKey("
          << (key.type() == QSsl::PublicKey ? "PublicKey" : "PrivateKey")
          << ", " << (key.algorithm() == QSsl::Opaque ? "OPAQUE" :
                     (key.algorithm() == QSsl::Rsa ? "RSA" :
                     (key.algorithm() == QSsl::Dsa ? "DSA" :
                     (key.algorithm() == QSsl::Dh ? "DH" : "EC"))))
          << ", " << key.length()
          << ')';
    return debug;
}